

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O1

bool absl::debugging_internal::ParseTemplateArg(State *state)

{
  ParseState *pPVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  ParseState copy;
  undefined8 local_38;
  undefined8 uStack_30;
  
  iVar2 = state->recursion_depth;
  iVar3 = state->steps;
  state->recursion_depth = iVar2 + 1;
  state->steps = iVar3 + 1;
  if (0x1ffff < iVar3 || 0xff < iVar2) {
    bVar4 = false;
    goto LAB_0026b52e;
  }
  local_38._0_4_ = (state->parse_state).mangled_idx;
  local_38._4_4_ = (state->parse_state).out_cur_idx;
  uStack_30 = *(undefined8 *)&(state->parse_state).prev_name_idx;
  bVar4 = ParseOneCharToken(state,'J');
  if (bVar4) {
    do {
      bVar4 = ParseTemplateArg(state);
    } while (bVar4);
    bVar5 = ParseOneCharToken(state,'E');
    bVar4 = true;
    if (bVar5) goto LAB_0026b52e;
  }
  pPVar1 = &state->parse_state;
  pPVar1->mangled_idx = (undefined4)local_38;
  pPVar1->out_cur_idx = local_38._4_4_;
  *(undefined8 *)&(state->parse_state).prev_name_idx = uStack_30;
  bVar5 = ParseLocalSourceName(state);
  if (bVar5) {
    ParseTemplateArgs(state);
    local_38._0_4_ = pPVar1->mangled_idx;
    local_38._4_4_ = pPVar1->out_cur_idx;
    uStack_30 = *(undefined8 *)&(state->parse_state).prev_name_idx;
    bVar6 = ParseExprCastValueAndTrailingE(state);
LAB_0026b5ad:
    bVar4 = true;
    if (bVar6 != false) goto LAB_0026b52e;
  }
  else {
    bVar6 = ParseType(state);
    bVar4 = true;
    if (bVar6) goto LAB_0026b52e;
    bVar6 = ParseExprPrimary(state);
    if (bVar6) goto LAB_0026b52e;
    pPVar1->mangled_idx = (undefined4)local_38;
    pPVar1->out_cur_idx = local_38._4_4_;
    *(undefined8 *)&(state->parse_state).prev_name_idx = uStack_30;
    bVar6 = ParseOneCharToken(state,'X');
    if (bVar6) {
      bVar6 = ParseExpression(state);
      if (bVar6) {
        bVar6 = ParseOneCharToken(state,'E');
        if (bVar6) goto LAB_0026b52e;
      }
    }
    pPVar1->mangled_idx = (undefined4)local_38;
    pPVar1->out_cur_idx = local_38._4_4_;
    *(undefined8 *)&(state->parse_state).prev_name_idx = uStack_30;
    bVar4 = ParseTemplateParamDecl(state);
    if (bVar4) {
      bVar6 = ParseTemplateArg(state);
      goto LAB_0026b5ad;
    }
  }
  pPVar1->mangled_idx = (undefined4)local_38;
  pPVar1->out_cur_idx = local_38._4_4_;
  *(undefined8 *)&(state->parse_state).prev_name_idx = uStack_30;
  bVar4 = bVar5;
LAB_0026b52e:
  state->recursion_depth = state->recursion_depth + -1;
  return bVar4;
}

Assistant:

static bool ParseTemplateArg(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  ParseState copy = state->parse_state;
  if (ParseOneCharToken(state, 'J') && ZeroOrMore(ParseTemplateArg, state) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  state->parse_state = copy;

  // There can be significant overlap between the following leading to
  // exponential backtracking:
  //
  //   <expr-primary> ::= L <type> <expr-cast-value> E
  //                 e.g. L 2xxIvE 1                 E
  //   <type>         ==> <local-source-name> <template-args>
  //                 e.g. L 2xx               IvE
  //
  // This means parsing an entire <type> twice, and <type> can contain
  // <template-arg>, so this can generate exponential backtracking.  There is
  // only overlap when the remaining input starts with "L <source-name>", so
  // parse all cases that can start this way jointly to share the common prefix.
  //
  // We have:
  //
  //   <template-arg> ::= <type>
  //                  ::= <expr-primary>
  //
  // First, drop all the productions of <type> that must start with something
  // other than 'L'.  All that's left is <class-enum-type>; inline it.
  //
  //   <type> ::= <nested-name> # starts with 'N'
  //          ::= <unscoped-name>
  //          ::= <unscoped-template-name> <template-args>
  //          ::= <local-name> # starts with 'Z'
  //
  // Drop and inline again:
  //
  //   <type> ::= <unscoped-name>
  //          ::= <unscoped-name> <template-args>
  //          ::= <substitution> <template-args> # starts with 'S'
  //
  // Merge the first two, inline <unscoped-name>, drop last:
  //
  //   <type> ::= <unqualified-name> [<template-args>]
  //          ::= St <unqualified-name> [<template-args>] # starts with 'S'
  //
  // Drop and inline:
  //
  //   <type> ::= <operator-name> [<template-args>] # starts with lowercase
  //          ::= <ctor-dtor-name> [<template-args>] # starts with 'C' or 'D'
  //          ::= <source-name> [<template-args>] # starts with digit
  //          ::= <local-source-name> [<template-args>]
  //          ::= <unnamed-type-name> [<template-args>] # starts with 'U'
  //
  // One more time:
  //
  //   <type> ::= L <source-name> [<template-args>]
  //
  // Likewise with <expr-primary>:
  //
  //   <expr-primary> ::= L <type> <expr-cast-value> E
  //                  ::= LZ <encoding> E # cannot overlap; drop
  //                  ::= L <mangled_name> E # cannot overlap; drop
  //
  // By similar reasoning as shown above, the only <type>s starting with
  // <source-name> are "<source-name> [<template-args>]".  Inline this.
  //
  //   <expr-primary> ::= L <source-name> [<template-args>] <expr-cast-value> E
  //
  // Now inline both of these into <template-arg>:
  //
  //   <template-arg> ::= L <source-name> [<template-args>]
  //                  ::= L <source-name> [<template-args>] <expr-cast-value> E
  //
  // Merge them and we're done:
  //   <template-arg>
  //     ::= L <source-name> [<template-args>] [<expr-cast-value> E]
  if (ParseLocalSourceName(state) && Optional(ParseTemplateArgs(state))) {
    copy = state->parse_state;
    if (ParseExprCastValueAndTrailingE(state)) {
      return true;
    }
    state->parse_state = copy;
    return true;
  }

  // Now that the overlapping cases can't reach this code, we can safely call
  // both of these.
  if (ParseType(state) || ParseExprPrimary(state)) {
    return true;
  }
  state->parse_state = copy;

  if (ParseOneCharToken(state, 'X') && ParseExpression(state) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  state->parse_state = copy;

  if (ParseTemplateParamDecl(state) && ParseTemplateArg(state)) {
    return true;
  }
  state->parse_state = copy;

  return false;
}